

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O2

ma_result ma_data_source_read_pcm_frames
                    (ma_data_source *pDataSource,void *pFramesOut,ma_uint64 frameCount,
                    ma_uint64 *pFramesRead)

{
  int iVar1;
  ma_result mVar2;
  ma_result mVar3;
  uint uVar4;
  ma_data_source *pDataSource_00;
  ma_uint64 mVar5;
  ma_data_source_base *pDataSourceBase;
  ma_data_source_base *pCurrentDataSource;
  int local_54;
  ma_uint32 channels;
  ma_format format;
  ulong local_48;
  ma_uint64 framesProcessed;
  ma_uint64 *local_38;
  
  if (pFramesRead != (ma_uint64 *)0x0) {
    *pFramesRead = 0;
  }
  if (pDataSource == (ma_data_source *)0x0 || frameCount == 0) {
    mVar3 = MA_INVALID_ARGS;
  }
  else {
    iVar1 = *(int *)((long)pDataSource + 0x40);
    mVar2 = ma_data_source_get_data_format
                      (pDataSource,&format,&channels,(ma_uint32 *)0x0,(ma_channel *)0x0,0);
    if (mVar2 == MA_SUCCESS) {
      local_48 = 0;
      mVar5 = 0;
      local_54 = iVar1;
      local_38 = pFramesRead;
      while (mVar5 <= frameCount && frameCount - mVar5 != 0) {
        ma_data_source_resolve_current(pDataSource,&pCurrentDataSource);
        mVar2 = MA_SUCCESS;
        if (pCurrentDataSource == (ma_data_source_base *)0x0) goto LAB_001613af;
        mVar2 = ma_data_source_read_pcm_frames_within_range
                          (pCurrentDataSource,pFramesOut,frameCount - mVar5,&framesProcessed);
        mVar5 = mVar5 + framesProcessed;
        if (mVar2 != MA_SUCCESS) {
          if (mVar2 != MA_AT_END) goto LAB_001613af;
          if (local_54 == 0) {
            pDataSource_00 = pCurrentDataSource->pNext;
            if (pDataSource_00 == (ma_data_source *)0x0) {
              mVar2 = MA_SUCCESS;
              if (pCurrentDataSource->onGetNext == (ma_data_source_get_next_proc)0x0)
              goto LAB_001613af;
              pDataSource_00 = (*pCurrentDataSource->onGetNext)(pCurrentDataSource);
              *(ma_data_source **)((long)pDataSource + 0x28) = pDataSource_00;
              if (pDataSource_00 == (ma_data_source *)0x0) goto LAB_001613af;
            }
            else {
              *(ma_data_source **)((long)pDataSource + 0x28) = pDataSource_00;
            }
            mVar2 = ma_data_source_seek_to_pcm_frame(pDataSource_00,0);
          }
          else {
            uVar4 = 0;
            if ((framesProcessed == 0) && (uVar4 = (int)local_48 + 1, 1 < uVar4)) break;
            mVar2 = ma_data_source_seek_to_pcm_frame
                              (pCurrentDataSource,pCurrentDataSource->loopBegInFrames);
            local_48 = (ulong)uVar4;
          }
          if (mVar2 != MA_SUCCESS) goto LAB_001613af;
        }
        if (pFramesOut == (void *)0x0) {
          pFramesOut = (void *)0x0;
        }
        else {
          pFramesOut = (void *)((long)pFramesOut +
                               (*(int *)(&DAT_001908a0 + (ulong)format * 4) * channels) *
                               framesProcessed);
        }
      }
      mVar2 = MA_SUCCESS;
LAB_001613af:
      if (local_38 != (ma_uint64 *)0x0) {
        *local_38 = mVar5;
      }
      mVar3 = MA_AT_END;
      if (mVar5 != 0) {
        mVar3 = mVar2;
      }
      if (mVar2 != MA_SUCCESS) {
        mVar3 = mVar2;
      }
    }
    else {
      ma_data_source_resolve_current(pDataSource,&pCurrentDataSource);
      mVar3 = ma_data_source_read_pcm_frames_within_range
                        (pCurrentDataSource,pFramesOut,frameCount,pFramesRead);
    }
  }
  return mVar3;
}

Assistant:

MA_API ma_result ma_data_source_read_pcm_frames(ma_data_source* pDataSource, void* pFramesOut, ma_uint64 frameCount, ma_uint64* pFramesRead)
{
    ma_result result = MA_SUCCESS;
    ma_data_source_base* pDataSourceBase = (ma_data_source_base*)pDataSource;
    ma_data_source_base* pCurrentDataSource;
    void* pRunningFramesOut = pFramesOut;
    ma_uint64 totalFramesProcessed = 0;
    ma_format format;
    ma_uint32 channels;
    ma_uint32 emptyLoopCounter = 0; /* Keeps track of how many times 0 frames have been read. For infinite loop detection of sounds with no audio data. */
    ma_bool32 loop;

    if (pFramesRead != NULL) {
        *pFramesRead = 0;
    }

    if (frameCount == 0) {
        return MA_INVALID_ARGS;
    }

    if (pDataSourceBase == NULL) {
        return MA_INVALID_ARGS;
    }

    loop = ma_data_source_is_looping(pDataSource);

    /*
    We need to know the data format so we can advance the output buffer as we read frames. If this
    fails, chaining will not work and we'll just read as much as we can from the current source.
    */
    if (ma_data_source_get_data_format(pDataSource, &format, &channels, NULL, NULL, 0) != MA_SUCCESS) {
        result = ma_data_source_resolve_current(pDataSource, (ma_data_source**)&pCurrentDataSource);
        if (result != MA_SUCCESS) {
            return result;
        }

        return ma_data_source_read_pcm_frames_within_range(pCurrentDataSource, pFramesOut, frameCount, pFramesRead);
    }

    /*
    Looping is a bit of a special case. When the `loop` argument is true, chaining will not work and
    only the current data source will be read from.
    */

    /* Keep reading until we've read as many frames as possible. */
    while (totalFramesProcessed < frameCount) {
        ma_uint64 framesProcessed;
        ma_uint64 framesRemaining = frameCount - totalFramesProcessed;

        /* We need to resolve the data source that we'll actually be reading from. */
        result = ma_data_source_resolve_current(pDataSource, (ma_data_source**)&pCurrentDataSource);
        if (result != MA_SUCCESS) {
            break;
        }

        if (pCurrentDataSource == NULL) {
            break;
        }

        result = ma_data_source_read_pcm_frames_within_range(pCurrentDataSource, pRunningFramesOut, framesRemaining, &framesProcessed);
        totalFramesProcessed += framesProcessed;

        /*
        If we encountered an error from the read callback, make sure it's propagated to the caller. The caller may need to know whether or not MA_BUSY is returned which is
        not necessarily considered an error.
        */
        if (result != MA_SUCCESS && result != MA_AT_END) {
            break;
        }

        /*
        We can determine if we've reached the end by checking if ma_data_source_read_pcm_frames_within_range() returned
        MA_AT_END. To loop back to the start, all we need to do is seek back to the first frame.
        */
        if (result == MA_AT_END) {
            /*
            The result needs to be reset back to MA_SUCCESS (from MA_AT_END) so that we don't
            accidentally return MA_AT_END when data has been read in prior loop iterations. at the
            end of this function, the result will be checked for MA_SUCCESS, and if the total
            number of frames processed is 0, will be explicitly set to MA_AT_END.
            */
            result = MA_SUCCESS;

            /*
            We reached the end. If we're looping, we just loop back to the start of the current
            data source. If we're not looping we need to check if we have another in the chain, and
            if so, switch to it.
            */
            if (loop) {
                if (framesProcessed == 0) {
                    emptyLoopCounter += 1;
                    if (emptyLoopCounter > 1) {
                        break;  /* Infinite loop detected. Get out. */
                    }
                } else {
                    emptyLoopCounter = 0;
                }

                result = ma_data_source_seek_to_pcm_frame(pCurrentDataSource, pCurrentDataSource->loopBegInFrames);
                if (result != MA_SUCCESS) {
                    break;  /* Failed to loop. Abort. */
                }

                /* Don't return MA_AT_END for looping sounds. */
                result = MA_SUCCESS;
            } else {
                if (pCurrentDataSource->pNext != NULL) {
                    pDataSourceBase->pCurrent = pCurrentDataSource->pNext;
                } else if (pCurrentDataSource->onGetNext != NULL) {
                    pDataSourceBase->pCurrent = pCurrentDataSource->onGetNext(pCurrentDataSource);
                    if (pDataSourceBase->pCurrent == NULL) {
                        break;  /* Our callback did not return a next data source. We're done. */
                    }
                } else {
                    /* Reached the end of the chain. We're done. */
                    break;
                }

                /* The next data source needs to be rewound to ensure data is read in looping scenarios. */
                result = ma_data_source_seek_to_pcm_frame(pDataSourceBase->pCurrent, 0);
                if (result != MA_SUCCESS) {
                    break;
                }
            }
        }

        if (pRunningFramesOut != NULL) {
            pRunningFramesOut = ma_offset_ptr(pRunningFramesOut, framesProcessed * ma_get_bytes_per_frame(format, channels));
        }
    }

    if (pFramesRead != NULL) {
        *pFramesRead = totalFramesProcessed;
    }

    MA_ASSERT(!(result == MA_AT_END && totalFramesProcessed > 0));  /* We should never be returning MA_AT_END if we read some data. */

    if (result == MA_SUCCESS && totalFramesProcessed == 0) {
        result  = MA_AT_END;
    }

    return result;
}